

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

error_code __thiscall libtorrent::aux::torrent::initialize_merkle_trees(torrent *this)

{
  bool bVar1;
  int s;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  info_hash_t *this_00;
  element_type *peVar2;
  file_storage *this_01;
  int64_t iVar3;
  value_type *pvVar4;
  merkle_tree local_d8;
  char *local_a0;
  char *local_98;
  int local_90;
  int local_8c;
  undefined1 local_88 [8];
  span<const_char> piece_layer;
  char *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  file_index_t local_54;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_50;
  file_index_t i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_44;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  file_storage *fs;
  bool valid;
  torrent *this_local;
  
  this_00 = info_hash(this);
  bVar1 = info_hash_t::has_v2(this_00);
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    fs._7_1_ = torrent_info::v2_piece_hashes_verified(peVar2);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    this_01 = torrent_info::orig_files(peVar2);
    s = file_storage::num_files(this_01);
    container_wrapper<libtorrent::aux::merkle_tree,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>>
    ::reserve<int,void>((container_wrapper<libtorrent::aux::merkle_tree,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>>
                         *)&this->m_merkle_trees,s);
    ___end2 = file_storage::file_range(this_01);
    local_44 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                        *)&__end2);
    rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
          ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 *)&__end2);
    while( true ) {
      i.m_val = (int)local_44.m_idx.m_val;
      local_50 = rhs.m_idx.m_val;
      bVar1 = libtorrent::operator!=(local_44,rhs);
      if (!bVar1) break;
      local_58 = (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                      ::operator*(&local_44);
      local_54.m_val = local_58;
      bVar1 = file_storage::pad_file_at(this_01,(file_index_t)local_58);
      if (bVar1) {
LAB_0066661f:
        ::std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
        emplace_back<>(&(this->m_merkle_trees).
                        super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                      );
      }
      else {
        local_5c = local_54.m_val;
        iVar3 = file_storage::file_size(this_01,local_54);
        if (iVar3 == 0) goto LAB_0066661f;
        local_64 = local_54.m_val;
        local_60 = file_storage::file_num_blocks(this_01,local_54);
        local_68 = file_storage::blocks_per_piece(this_01);
        piece_layer.m_len._4_4_ = local_54.m_val;
        local_70 = file_storage::root_ptr(this_01,local_54);
        ::std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>::
        emplace_back<int,int,char_const*>
                  ((vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>
                    *)&this->m_merkle_trees,&local_60,&local_68,&local_70);
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        local_8c = local_54.m_val;
        _local_88 = torrent_info::piece_layer(peVar2,local_54);
        bVar1 = span<const_char>::empty((span<const_char> *)local_88);
        if (bVar1) {
          fs._7_1_ = false;
        }
        else {
          local_90 = local_54.m_val;
          pvVar4 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                   ::operator[](&this->m_merkle_trees,
                                (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                local_54.m_val);
          local_a0 = (char *)local_88;
          local_98 = piece_layer.m_ptr;
          bVar1 = merkle_tree::load_piece_layer(pvVar4,_local_88);
          if (!bVar1) {
            local_d8.m_block_verified.m_buf.
            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 (unique_ptr<unsigned_int[],_long>)
                 (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0;
            local_d8.m_num_blocks = 0;
            local_d8.m_blocks_per_piece_log = '\0';
            local_d8.m_mode = uninitialized_tree;
            local_d8._46_2_ = 0;
            local_d8.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_d8.m_root = (char *)0x0;
            local_d8.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            merkle_tree::merkle_tree(&local_d8);
            pvVar4 = container_wrapper<libtorrent::aux::merkle_tree,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>_>
                     ::operator[](&this->m_merkle_trees,
                                  (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                  local_54.m_val);
            merkle_tree::operator=(pvVar4,&local_d8);
            merkle_tree::~merkle_tree(&local_d8);
            *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xf7ffffff;
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)&this_local,torrent_invalid_piece_layer,(type *)0x0);
            return _this_local;
          }
        }
      }
      index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
      operator++(&local_44);
    }
    *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xf7ffffff | (uint)fs._7_1_ << 0x1b;
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    torrent_info::free_piece_layers(peVar2);
    boost::system::error_code::error_code((error_code *)&this_local);
  }
  else {
    boost::system::error_code::error_code((error_code *)&this_local);
  }
  return _this_local;
}

Assistant:

error_code torrent::initialize_merkle_trees()
	{
		if (!info_hash().has_v2()) return {};

		bool valid = m_torrent_file->v2_piece_hashes_verified();

		file_storage const& fs = m_torrent_file->orig_files();
		m_merkle_trees.reserve(fs.num_files());
		for (file_index_t i : fs.file_range())
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
			{
				m_merkle_trees.emplace_back();
				continue;
			}
			m_merkle_trees.emplace_back(fs.file_num_blocks(i)
				, fs.blocks_per_piece(), fs.root_ptr(i));
			auto const piece_layer = m_torrent_file->piece_layer(i);
			if (piece_layer.empty())
			{
				valid = false;
				continue;
			}

			if (!m_merkle_trees[i].load_piece_layer(piece_layer))
			{
				m_merkle_trees[i] = aux::merkle_tree();
				m_v2_piece_layers_validated = false;
				return errors::torrent_invalid_piece_layer;
			}
		}

		m_v2_piece_layers_validated = valid;

		m_torrent_file->free_piece_layers();
		return {};
	}